

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

bool duckdb::ExtensionTypeInfo::Equals
               (optional_ptr<duckdb::ExtensionTypeInfo,_true> lhs,
               optional_ptr<duckdb::ExtensionTypeInfo,_true> rhs)

{
  bool bVar1;
  bool bVar2;
  ExtensionTypeInfo *pEVar3;
  ExtensionTypeInfo *pEVar4;
  ulong uVar5;
  ulong uVar6;
  const_reference this;
  const_reference rhs_00;
  const_iterator cVar7;
  idx_t i;
  size_type __n;
  __node_base *p_Var8;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> rhs_local;
  optional_ptr<duckdb::ExtensionTypeInfo,_true> lhs_local;
  
  bVar1 = true;
  if (((rhs.ptr != (ExtensionTypeInfo *)0x0) && (lhs.ptr != (ExtensionTypeInfo *)0x0)) &&
     (lhs.ptr != rhs.ptr)) {
    rhs_local = rhs;
    lhs_local = lhs;
    pEVar3 = optional_ptr<duckdb::ExtensionTypeInfo,_true>::operator->(&lhs_local);
    pEVar4 = optional_ptr<duckdb::ExtensionTypeInfo,_true>::operator->(&rhs_local);
    uVar5 = ((long)(pEVar3->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar3->modifiers).
                  super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                  .
                  super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x60;
    uVar6 = ((long)(pEVar4->modifiers).
                   super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   .
                   super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar4->modifiers).
                  super_vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                  .
                  super__Vector_base<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x60;
    if (uVar5 < uVar6) {
      uVar6 = uVar5;
    }
    for (__n = 0; uVar6 != __n; __n = __n + 1) {
      this = vector<duckdb::LogicalTypeModifier,_true>::get<true>(&pEVar3->modifiers,__n);
      rhs_00 = vector<duckdb::LogicalTypeModifier,_true>::get<true>(&pEVar4->modifiers,__n);
      bVar1 = LogicalType::operator!=((LogicalType *)this,(LogicalType *)rhs_00);
      if (bVar1) {
        return false;
      }
      bVar1 = (this->value).is_null;
      bVar2 = (rhs_00->value).is_null;
      if ((bVar1 != true) || ((bVar2 & 1U) == 0)) {
        if (bVar1 != bVar2) {
          return false;
        }
        bVar1 = Value::operator!=(&this->value,&rhs_00->value);
        if (bVar1) {
          return false;
        }
      }
    }
    pEVar3 = optional_ptr<duckdb::ExtensionTypeInfo,_true>::operator->(&lhs_local);
    pEVar4 = optional_ptr<duckdb::ExtensionTypeInfo,_true>::operator->(&rhs_local);
    p_Var8 = &(pEVar3->properties)._M_h._M_before_begin;
    do {
      p_Var8 = p_Var8->_M_nxt;
      bVar1 = p_Var8 == (__node_base *)0x0;
      if (bVar1) {
        return bVar1;
      }
      cVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pEVar4->properties)._M_h,(key_type *)(p_Var8 + 1));
    } while ((cVar7.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
              ._M_cur == (__node_type *)0x0) ||
            (bVar2 = Value::operator!=((Value *)(p_Var8 + 5),
                                       (Value *)((long)cVar7.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                                  ._M_cur + 0x28)), !bVar2));
  }
  return bVar1;
}

Assistant:

bool ExtensionTypeInfo::Equals(optional_ptr<ExtensionTypeInfo> lhs, optional_ptr<ExtensionTypeInfo> rhs) {
	// Either both are null, or both are the same, so they are equal
	if (lhs.get() == rhs.get()) {
		return true;
	}
	// If one is null, then we cant compare them
	if (lhs == nullptr || rhs == nullptr) {
		return true;
	}

	// Both are not null, so we can compare them
	D_ASSERT(lhs != nullptr && rhs != nullptr);

	// Compare modifiers
	const auto &lhs_mods = lhs->modifiers;
	const auto &rhs_mods = rhs->modifiers;
	const auto common_mods = MinValue(lhs_mods.size(), rhs_mods.size());
	for (idx_t i = 0; i < common_mods; i++) {
		// If the types are not strictly equal, they are not equal
		auto &lhs_val = lhs_mods[i].value;
		auto &rhs_val = rhs_mods[i].value;

		if (lhs_val.type() != rhs_val.type()) {
			return false;
		}

		// If both are null, its fine
		if (lhs_val.IsNull() && rhs_val.IsNull()) {
			continue;
		}

		// If one is null, the other must be null too
		if (lhs_val.IsNull() != rhs_val.IsNull()) {
			return false;
		}

		if (lhs_val != rhs_val) {
			return false;
		}
	}

	// Properties are optional, so only compare those present in both
	const auto &lhs_props = lhs->properties;
	const auto &rhs_props = rhs->properties;

	for (const auto &kv : lhs_props) {
		auto it = rhs_props.find(kv.first);
		if (it == rhs_props.end()) {
			// Continue
			continue;
		}
		if (kv.second != it->second) {
			// Mismatch!
			return false;
		}
	}

	// All ok!
	return true;
}